

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

string_t __thiscall
duckdb::VectorStringCastOperator<duckdb::NumericTryCastToBit>::
Operation<duckdb::hugeint_t,duckdb::string_t>
          (VectorStringCastOperator<duckdb::NumericTryCastToBit> *this,hugeint_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  _Alloc_hider _Var1;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t data;
  hugeint_t numeric;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  string local_30;
  
  numeric.upper = input.lower;
  numeric.lower = (uint64_t)this;
  Bit::NumericToBit<duckdb::hugeint_t>(&local_30,numeric);
  if ((uint)local_30._M_string_length < 0xd) {
    local_34 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    if ((uint)local_30._M_string_length == 0) {
      _Var1._M_p = (pointer)0x0;
    }
    else {
      switchD_012b9b0d::default
                (&uStack_3c,local_30._M_dataplus._M_p,(ulong)((uint)local_30._M_string_length & 0xf)
                );
      _Var1._M_p = (pointer)CONCAT44(local_34,uStack_38);
    }
  }
  else {
    uStack_3c = *(undefined4 *)local_30._M_dataplus._M_p;
    _Var1._M_p = local_30._M_dataplus._M_p;
  }
  data.value.pointer.ptr = (char *)mask;
  data.value._0_8_ = _Var1._M_p;
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddStringOrBlob
                 ((StringVector *)idx,(Vector *)CONCAT44(uStack_3c,(uint)local_30._M_string_length),
                  data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto result = reinterpret_cast<Vector *>(dataptr);
		return OP::template Operation<INPUT_TYPE>(input, *result);
	}